

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

shared_ptr<Stmt> __thiscall Parser::program(Parser *this)

{
  int i;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int i_00;
  shared_ptr<Stmt> sVar2;
  
  block(this);
  i = Node::labels + 1;
  i_00 = Node::labels + 2;
  Node::labels = i_00;
  Node::emitlabel((Node *)(this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i);
  peVar1 = (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)&(((peVar1->prev).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->table).
               _M_t)(peVar1,i,i_00);
  Node::emitlabel((Node *)(this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  i_00);
  sVar2.super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Stmt>)sVar2.super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Stmt> program() {
		// It starts to produce AST
		std::shared_ptr<Stmt> s = block();
	
		// It generates the beginning of the program
		int begin = s->newlabel();
		int after = s->newlabel();
		s->emitlabel(begin);
		s->gen(begin, after);
		s->emitlabel(after);

		return s;
	}